

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSA.h
# Opt level: O0

void __thiscall RSA::print_last_key(RSA *this)

{
  ostream *poVar1;
  BigInt local_d8;
  BigInt local_b8;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  RSA *local_10;
  RSA *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Public Key Pair",&local_31);
  Crypto::print_header(&this->super_Crypto,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  poVar1 = std::operator<<((ostream *)&std::cout,"e: ");
  poVar1 = operator<<(poVar1,&this->e);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"n: ");
  poVar1 = operator<<(poVar1,&this->n);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Private Key Pair",&local_69);
  Crypto::print_header(&this->super_Crypto,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  poVar1 = std::operator<<((ostream *)&std::cout,"d: ");
  poVar1 = operator<<(poVar1,&this->d);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"n: ");
  poVar1 = operator<<(poVar1,&this->n);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"(E*D)%Phi",&local_91);
  Crypto::print_header(&this->super_Crypto,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  poVar1 = std::operator<<((ostream *)&std::cout,"Euler Identity: (E*D)%Phi=");
  BigInt::operator*(&local_d8,&this->e,&this->d);
  BigInt::operator%(&local_b8,&local_d8,&this->phi);
  poVar1 = operator<<(poVar1,&local_b8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  BigInt::~BigInt(&local_b8);
  BigInt::~BigInt(&local_d8);
  return;
}

Assistant:

void RSA::print_last_key() {
    print_header("Public Key Pair");
    cout << "e: " << e << endl << "n: " << n << endl;

    print_header("Private Key Pair");
    cout << "d: " << d << endl << "n: " << n << endl;

    print_header("(E*D)%Phi");
    cout << "Euler Identity: (E*D)%Phi=" << (e * d) % phi << endl;
}